

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrintBrief_abi_cxx11_
          (JointPolicyPureVectorForClusteredBG *this)

{
  bool bVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  E *this_00;
  ostream *poVar3;
  size_t sVar4;
  JointPolicy *in_RSI;
  string *in_RDI;
  bool bVar5;
  stringstream ss;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> *in_stack_fffffffffffffdd8;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_stack_fffffffffffffde0;
  JointPolicyDiscretePure *in_stack_fffffffffffffdf0;
  JointPolicyDiscretePure *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe08;
  stringstream local_1b8 [16];
  ostream local_1a8 [424];
  
  JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared(in_stack_fffffffffffffdf8);
  bVar1 = boost::operator==(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bVar5 = false;
  if (bVar1) {
    pIVar2 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure(in_stack_fffffffffffffdf0);
    bVar5 = pIVar2 == (Interface_ProblemToPolicyDiscretePure *)0x0;
  }
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8ca874);
  if (bVar5) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,in_stack_fffffffffffffe08);
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::operator<<(local_1a8,"JPPV4CBG_d");
  sVar4 = JointPolicy::GetDepth(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3,"_cur");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
  poVar3 = std::operator<<(poVar3,"_prev");
  boost::operator<<(poVar3,in_stack_fffffffffffffdd8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return in_RDI;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrintBrief() const
{
    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrintBrief - Error!!! PTPDP==0");
            
    stringstream ss;
    ss << "JPPV4CBG_d"<<GetDepth() << "_cur" << this << "_prev" << _m_prevJPolBG;
    return(ss.str());
}